

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_create_view.cpp
# Opt level: O2

unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>,_true> __thiscall
duckdb::Transformer::TransformCreateView(Transformer *this,PGViewStmt *stmt)

{
  char cVar1;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var2;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> _Var3;
  undefined8 uVar4;
  bool bVar5;
  OnCreateConflict OVar6;
  pointer pCVar7;
  PGValue *pPVar8;
  pointer pCVar9;
  NotImplementedException *pNVar10;
  ParserException *this_00;
  long in_RDX;
  pointer *__ptr;
  undefined8 *puVar11;
  Transformer *this_01;
  undefined1 local_c8 [16];
  optional_ptr<duckdb_libpgquery::PGValue,_true> val;
  undefined1 local_b0 [32];
  QualifiedName qname;
  
  this_01 = (Transformer *)local_c8;
  make_uniq<duckdb::CreateStatement>();
  make_uniq<duckdb::CreateViewInfo>();
  TransformQualifiedName(&qname,(Transformer *)stmt,*(PGRangeVar **)(in_RDX + 8));
  pCVar7 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                       *)local_c8);
  ::std::__cxx11::string::_M_assign((string *)&(pCVar7->super_CreateInfo).catalog);
  pCVar7 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                       *)local_c8);
  ::std::__cxx11::string::_M_assign((string *)&(pCVar7->super_CreateInfo).schema);
  pCVar7 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                       *)local_c8);
  ::std::__cxx11::string::_M_assign((string *)&pCVar7->view_name);
  cVar1 = *(char *)(*(long *)(in_RDX + 8) + 0x21);
  pCVar7 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                       *)local_c8);
  (pCVar7->super_CreateInfo).temporary = cVar1 == '\0';
  pCVar7 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                       *)local_c8);
  if ((pCVar7->super_CreateInfo).temporary == true) {
    pCVar7 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::
             operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                         *)local_c8);
    this_01 = (Transformer *)&(pCVar7->super_CreateInfo).catalog;
    bVar5 = IsInvalidCatalog((string *)this_01);
    if (bVar5) {
      pCVar7 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
               ::operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                             *)local_c8);
      this_01 = (Transformer *)&(pCVar7->super_CreateInfo).catalog;
      ::std::__cxx11::string::assign((char *)this_01);
    }
  }
  OVar6 = TransformOnConflict(this_01,*(PGOnCreateConflict *)(in_RDX + 0x20));
  pCVar7 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                       *)local_c8);
  (pCVar7->super_CreateInfo).on_conflict = OVar6;
  TransformSelectStmt((Transformer *)local_b0,(PGNode *)stmt,SUB81(*(undefined8 *)(in_RDX + 0x18),0)
                     );
  pCVar7 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                       *)local_c8);
  uVar4 = local_b0._0_8_;
  local_b0._0_8_ = (Transformer *)0x0;
  _Var2._M_head_impl =
       (pCVar7->query).
       super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
       .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
  (pCVar7->query).
  super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
  super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>.
  super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = (SelectStatement *)uVar4;
  if (_Var2._M_head_impl != (SelectStatement *)0x0) {
    (**(code **)(*(long *)&(_Var2._M_head_impl)->super_SQLStatement + 8))();
    if ((Transformer *)local_b0._0_8_ != (Transformer *)0x0) {
      (*(code *)(*(__node_base_ptr *)local_b0._0_8_)[1]._M_nxt)();
    }
  }
  ::std::__cxx11::string::string((string *)local_b0,"view",(allocator *)&val);
  PivotEntryCheck((Transformer *)stmt,(string *)local_b0);
  ::std::__cxx11::string::~string((string *)local_b0);
  puVar11 = *(undefined8 **)(in_RDX + 0x10);
  if ((puVar11 != (undefined8 *)0x0) && (0 < *(int *)((long)puVar11 + 4))) {
    while (puVar11 = (undefined8 *)puVar11[1], puVar11 != (undefined8 *)0x0) {
      val.ptr = (PGValue *)*puVar11;
      pPVar8 = optional_ptr<duckdb_libpgquery::PGValue,_true>::operator->(&val);
      if (pPVar8->type != T_PGString) {
        pNVar10 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)local_b0,"View projection type",(allocator *)(local_c8 + 0xf));
        NotImplementedException::NotImplementedException(pNVar10,(string *)local_b0);
        __cxa_throw(pNVar10,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      pCVar7 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
               ::operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                             *)local_c8);
      pPVar8 = optional_ptr<duckdb_libpgquery::PGValue,_true>::operator->(&val);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char*&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &pCVar7->aliases,&(pPVar8->val).str);
    }
    pCVar7 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::
             operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                         *)local_c8);
    if ((pCVar7->aliases).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pCVar7->aliases).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      this_00 = (ParserException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)local_b0,"Need at least one column name in CREATE VIEW projection list",
                 (allocator *)&val);
      ParserException::ParserException(this_00,(string *)local_b0);
      __cxa_throw(this_00,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  uVar4 = local_c8._0_8_;
  if ((*(long *)(in_RDX + 0x28) != 0) && (0 < *(int *)(*(long *)(in_RDX + 0x28) + 4))) {
    pNVar10 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string((string *)local_b0,"VIEW options",(allocator *)&val);
    NotImplementedException::NotImplementedException(pNVar10,(string *)local_b0);
    __cxa_throw(pNVar10,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (*(int *)(in_RDX + 0x30) == 0) {
    local_c8._0_8_ =
         (__uniq_ptr_data<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true,_true>
          )0x0;
    pCVar9 = unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>,_true>
             ::operator->((unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>,_true>
                           *)this);
    _Var3._M_head_impl =
         (pCVar9->info).
         super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
         super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
         super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
    (pCVar9->info).super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>.
    _M_t.super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
    super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl = (CreateInfo *)uVar4;
    if (_Var3._M_head_impl != (CreateInfo *)0x0) {
      (**(code **)(*(long *)&(_Var3._M_head_impl)->super_ParseInfo + 8))();
    }
    QualifiedName::~QualifiedName(&qname);
    if ((_Tuple_impl<0UL,_duckdb::CreateViewInfo_*,_std::default_delete<duckdb::CreateViewInfo>_>)
        local_c8._0_8_ != (CreateViewInfo *)0x0) {
      (**(code **)(*(long *)local_c8._0_8_ + 8))();
    }
    return (unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>_>)
           (unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>_>)this;
  }
  pNVar10 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)local_b0,"VIEW CHECK options",(allocator *)&val);
  NotImplementedException::NotImplementedException(pNVar10,(string *)local_b0);
  __cxa_throw(pNVar10,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<CreateStatement> Transformer::TransformCreateView(duckdb_libpgquery::PGViewStmt &stmt) {
	D_ASSERT(stmt.type == duckdb_libpgquery::T_PGViewStmt);
	D_ASSERT(stmt.view);

	auto result = make_uniq<CreateStatement>();
	auto info = make_uniq<CreateViewInfo>();

	auto qname = TransformQualifiedName(*stmt.view);
	info->catalog = qname.catalog;
	info->schema = qname.schema;
	info->view_name = qname.name;
	info->temporary = !stmt.view->relpersistence;
	if (info->temporary && IsInvalidCatalog(info->catalog)) {
		info->catalog = TEMP_CATALOG;
	}
	info->on_conflict = TransformOnConflict(stmt.onconflict);

	info->query = TransformSelectStmt(*stmt.query, false);

	PivotEntryCheck("view");

	if (stmt.aliases && stmt.aliases->length > 0) {
		for (auto c = stmt.aliases->head; c != nullptr; c = lnext(c)) {
			auto val = PGPointerCast<duckdb_libpgquery::PGValue>(c->data.ptr_value);
			switch (val->type) {
			case duckdb_libpgquery::T_PGString: {
				info->aliases.emplace_back(val->val.str);
				break;
			}
			default:
				throw NotImplementedException("View projection type");
			}
		}
		if (info->aliases.empty()) {
			throw ParserException("Need at least one column name in CREATE VIEW projection list");
		}
	}

	if (stmt.options && stmt.options->length > 0) {
		throw NotImplementedException("VIEW options");
	}

	if (stmt.withCheckOption != duckdb_libpgquery::PGViewCheckOption::PG_NO_CHECK_OPTION) {
		throw NotImplementedException("VIEW CHECK options");
	}
	result->info = std::move(info);
	return result;
}